

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

int __thiscall
KMaxDistance::putValToItsSortedPlace(KMaxDistance *this,double val,double *vals,int numVals)

{
  int j;
  int i;
  int numVals_local;
  double *vals_local;
  double val_local;
  KMaxDistance *this_local;
  
  if (vals[numVals + -1] < val) {
    for (i = 0; i < numVals; i = i + 1) {
      if (vals[i] < val) {
        for (j = numVals + -1; i < j; j = j + -1) {
          vals[j] = vals[j + -1];
        }
        vals[i] = val;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int KMaxDistance::putValToItsSortedPlace( const double val, double *vals, const int numVals ){
    if ( val <= vals[numVals-1] ) return 0;
    for ( int i = 0; i < numVals; ++i ){
        if ( vals[i] >= val ) continue;
        for ( int j = numVals-1; j > i; --j ) vals[j] = vals[j-1];
        vals[i] = val;
        return 1;
    }
    return 0;
}